

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O0

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem,realtype t,realtype s,int *nvec)

{
  double dVar1;
  int i;
  realtype taui;
  realtype tau;
  int *nvec_local;
  realtype s_local;
  realtype t_local;
  ARKodeARKStepMem step_mem_local;
  
  step_mem->cvals[*nvec] = s;
  step_mem->Xvecs[*nvec] = *step_mem->forcing;
  *nvec = *nvec + 1;
  dVar1 = (t - step_mem->tshift) / step_mem->tscale;
  taui = dVar1;
  for (i = 1; i < step_mem->nforcing; i = i + 1) {
    step_mem->cvals[*nvec] = s * taui;
    step_mem->Xvecs[*nvec] = step_mem->forcing[i];
    taui = dVar1 * taui;
    *nvec = *nvec + 1;
  }
  return;
}

Assistant:

void arkStep_ApplyForcing(ARKodeARKStepMem step_mem, realtype t,
                          realtype s, int *nvec)
{
  realtype tau, taui;
  int i;

  /* always append the constant forcing term */
  step_mem->cvals[*nvec] = s;
  step_mem->Xvecs[*nvec] = step_mem->forcing[0];
  (*nvec) += 1;

  /* compute normalized time tau and initialize tau^i */
  tau  = (t - step_mem->tshift) / (step_mem->tscale);
  taui = tau;
  for (i=1; i<step_mem->nforcing; i++) {
    step_mem->cvals[*nvec] = s*taui;
    step_mem->Xvecs[*nvec] = step_mem->forcing[i];
    taui *= tau;
    (*nvec) += 1;
  }
}